

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::DeleteFromAcceptList(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  int iVar1;
  
  iVar1 = -0x5a;
  if ((((this->init == true) && (iVar1 = -0x59, this->created == true)) &&
      (iVar1 = -0x54, addr->addresstype == IPv4Address)) &&
     (iVar1 = -0x52, this->receivemode == AcceptSome)) {
    iVar1 = ProcessDeleteAcceptIgnoreEntry
                      (this,*(uint32_t *)&addr->field_0xc,*(uint16_t *)&addr[1]._vptr_RTPAddress);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int RTPUDPv4Transmitter::DeleteFromAcceptList(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	if (receivemode != RTPTransmitter::AcceptSome)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_DIFFERENTRECEIVEMODE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	status = ProcessDeleteAcceptIgnoreEntry(address.GetIP(),address.GetPort());

	MAINMUTEX_UNLOCK
	return status;
}